

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

uint Ivy_TruthDsdCompute_rec(int iNode,Vec_Int_t *vTree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = (ulong)(uint)iNode;
  if ((-1 < iNode) && (iNode < vTree->nSize)) {
    uVar5 = 0;
    do {
      uVar1 = vTree->pArray[uVar6];
      uVar7 = uVar1 & 0xf;
      if (uVar7 != 2) {
        switch(uVar7) {
        case 0:
          uVar4 = s_Masks[uVar6][(uVar1 & 0x10) == 0];
          break;
        case 1:
          uVar4 = s_Masks[5][(uVar1 & 0x10) == 0];
          break;
        default:
          if ((uVar1 & 0x10) != 0) {
            __assert_fail("Node.fCompl == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                          ,0x1ba,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
          }
          if (1 < uVar7 - 5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                          ,0x1ce,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
          }
          uVar2 = Ivy_TruthDsdCompute_rec(uVar1 >> 9 & 7,vTree);
          uVar3 = Ivy_TruthDsdCompute_rec(uVar1 >> 0xd & 7,vTree);
          uVar4 = Ivy_TruthDsdCompute_rec(uVar1 >> 0x11 & 7,vTree);
          uVar8 = uVar1 >> 8 & 1;
          if (uVar8 != 0 && uVar7 != 6) {
            __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                          ,0x1c5,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
          }
          uVar2 = uVar2 ^ -uVar8;
          uVar3 = uVar3 ^ (int)(uVar1 << 0x13) >> 0x1f;
          uVar4 = uVar4 ^ (int)(uVar1 << 0xf) >> 0x1f;
          if (uVar7 == 5) {
            uVar4 = (uVar3 ^ uVar4) & uVar2 ^ uVar4;
          }
          else {
            uVar4 = uVar4 & uVar3 | (uVar4 | uVar3) & uVar2;
          }
          break;
        case 3:
          uVar7 = uVar1 >> 5 & 7;
          if (uVar7 == 0) {
            uVar4 = 0xffffffff;
          }
          else {
            uVar3 = 0;
            uVar4 = 0xffffffff;
            uVar2 = uVar1 >> 8;
            do {
              uVar8 = Ivy_TruthDsdCompute_rec((uVar2 & 0xf) >> 1,vTree);
              uVar4 = (-(uVar2 & 1) ^ uVar8) & uVar4;
              uVar3 = uVar3 + 1;
              uVar2 = uVar1 >> 0xc;
            } while (uVar7 != uVar3);
          }
          uVar4 = (int)(uVar1 << 0x1b) >> 0x1f ^ uVar4;
          break;
        case 4:
          uVar7 = uVar1 >> 5 & 7;
          if (uVar7 == 0) {
            uVar4 = 0;
          }
          else {
            uVar3 = 0;
            uVar4 = 0;
            uVar2 = uVar1 >> 8;
            do {
              uVar8 = Ivy_TruthDsdCompute_rec((uVar2 & 0xf) >> 1,vTree);
              if ((uVar2 & 1) != 0) {
                __assert_fail("(Var & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                              ,0x1b6,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
              }
              uVar4 = uVar4 ^ uVar8;
              uVar3 = uVar3 + 1;
              uVar2 = uVar1 >> 0xc;
            } while (uVar7 != uVar3);
          }
          uVar4 = (int)(uVar1 << 0x1b) >> 0x1f ^ uVar4;
        }
        return uVar4 ^ uVar5;
      }
      uVar7 = uVar1 >> 9 & 7;
      uVar6 = (ulong)uVar7;
      uVar5 = (int)(uVar1 << 0x1b) >> 0x1f ^ uVar5;
    } while ((int)uVar7 < vTree->nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

unsigned Ivy_TruthDsdCompute_rec( int iNode, Vec_Int_t * vTree )
{
    unsigned uTruthChild, uTruthTotal;
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return s_Masks[5][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_PI )
        return s_Masks[iNode][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_BUF )
    {
        uTruthTotal = Ivy_TruthDsdCompute_rec( Node.Fan0 >> 1, vTree );
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_AND )
    {
        uTruthTotal = s_Masks[5][1];
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthChild = Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            uTruthTotal = (Var & 1)? uTruthTotal & ~uTruthChild : uTruthTotal & uTruthChild;
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_EXOR )
    {
        uTruthTotal = 0;
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthTotal ^= Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            assert( (Var & 1) == 0 );
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        unsigned uTruthChildC, uTruthChild1, uTruthChild0;
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        uTruthChildC = Ivy_TruthDsdCompute_rec( VarC >> 1, vTree );
        uTruthChild1 = Ivy_TruthDsdCompute_rec( Var1 >> 1, vTree );
        uTruthChild0 = Ivy_TruthDsdCompute_rec( Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        uTruthChildC = (VarC & 1)? ~uTruthChildC : uTruthChildC;
        uTruthChild1 = (Var1 & 1)? ~uTruthChild1 : uTruthChild1;
        uTruthChild0 = (Var0 & 1)? ~uTruthChild0 : uTruthChild0;
        if ( Node.Type == IVY_DEC_MUX )
            return (uTruthChildC & uTruthChild1) | (~uTruthChildC & uTruthChild0);
        else
            return (uTruthChildC & uTruthChild1) | (uTruthChildC & uTruthChild0) | (uTruthChild1 & uTruthChild0);
    }
    assert( 0 );
    return 0;
}